

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::FindLiveMembers
          (EliminateDeadMembersPass *this,Function *function)

{
  anon_class_8_1_8991fb9c local_40;
  function<void_(const_spvtools::opt::Instruction_*)> local_38;
  Function *local_18;
  Function *function_local;
  EliminateDeadMembersPass *this_local;
  
  local_40.this = this;
  local_18 = function;
  function_local = (Function *)this;
  std::function<void(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::EliminateDeadMembersPass::FindLiveMembers(spvtools::opt::Function_const&)::__0,void>
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_38,&local_40);
  opt::Function::ForEachInst(function,&local_38,false,false);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_38);
  return;
}

Assistant:

void EliminateDeadMembersPass::FindLiveMembers(const Function& function) {
  function.ForEachInst(
      [this](const Instruction* inst) { FindLiveMembers(inst); });
}